

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ExtPrivkey * __thiscall
cfd::core::ExtPrivkey::DerivePrivkey
          (ExtPrivkey *__return_storage_ptr__,ExtPrivkey *this,uint32_t child_num)

{
  initializer_list<unsigned_int> __l;
  allocator_type local_35;
  uint32_t local_34;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  
  __l._M_len = 1;
  __l._M_array = &local_34;
  local_34 = child_num;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&path,__l,&local_35);
  DerivePrivkey(__return_storage_ptr__,this,&path);
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return __return_storage_ptr__;
}

Assistant:

ExtPrivkey ExtPrivkey::DerivePrivkey(uint32_t child_num) const {
  std::vector<uint32_t> path = {child_num};
  return DerivePrivkey(path);
}